

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  UnitTest *this;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  char *local_148;
  char *original_dir;
  string local_138;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  undefined8 *puStack_18;
  int gtest_retval;
  ExecDeathTestArgs *args;
  void *child_arg_local;
  
  puStack_18 = (undefined8 *)child_arg;
  args = (ExecDeathTestArgs *)child_arg;
  while( true ) {
    do {
      local_1c = close(*(int *)(puStack_18 + 1));
      bVar3 = false;
      if (local_1c == -1) {
        piVar2 = __errno_location();
        bVar3 = *piVar2 == 4;
      }
    } while (bVar3);
    if (local_1c == -1) break;
    bVar3 = AlwaysFalse();
    if (!bVar3) {
      this = UnitTest::GetInstance();
      local_148 = UnitTest::original_working_dir(this);
      iVar1 = chdir(local_148);
      if (iVar1 == 0) {
        execv(*(char **)*puStack_18,(char **)*puStack_18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"execv(",&local_2b1)
        ;
        std::operator+(&local_290,&local_2b0,*(char **)*puStack_18);
        std::operator+(&local_270,&local_290,", ...) in ");
        std::operator+(&local_250,&local_270,local_148);
        std::operator+(&local_230,&local_250," failed: ");
        GetLastErrnoDescription_abi_cxx11_();
        std::operator+(&local_210,&local_230,&local_2d8);
        DeathTestAbort(&local_210);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c8,"chdir(\"",&local_1c9)
      ;
      std::operator+(&local_1a8,&local_1c8,local_148);
      std::operator+(&local_188,&local_1a8,"\") failed: ");
      GetLastErrnoDescription_abi_cxx11_();
      std::operator+(&local_168,&local_188,&local_1f0);
      DeathTestAbort(&local_168);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"CHECK failed: File ",&local_101);
  std::operator+(&local_e0,&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/build_O0/googletest-src/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_c0,&local_e0,", line ");
  original_dir._4_4_ = 0x4a3;
  StreamableToString<int>(&local_138,(int *)((long)&original_dir + 4));
  std::operator+(&local_a0,&local_c0,&local_138);
  std::operator+(&local_80,&local_a0,": ");
  std::operator+(&local_60,&local_80,"close(args->close_fd)");
  std::operator+(&local_40,&local_60," != -1");
  DeathTestAbort(&local_40);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir +
                   "\") failed: " + GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execv() as it's almost a direct system call. We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execv() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execv(args->argv[0], args->argv);
  DeathTestAbort(std::string("execv(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " + GetLastErrnoDescription());
  return EXIT_FAILURE;
}